

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int client_close_proxy(archive_read_filter *self)

{
  uint uVar1;
  uint local_24;
  uint i;
  int r2;
  int r;
  archive_read_filter *self_local;
  
  i = 0;
  if ((self->archive->client).closer == (undefined1 *)0x0) {
    self_local._4_4_ = 0;
  }
  else {
    for (local_24 = 0; local_24 < (self->archive->client).nodes; local_24 = local_24 + 1) {
      uVar1 = (*(code *)(self->archive->client).closer)
                        (self->archive,(self->archive->client).dataset[local_24].data);
      if ((int)uVar1 < (int)i) {
        i = uVar1;
      }
    }
    self_local._4_4_ = i;
  }
  return self_local._4_4_;
}

Assistant:

static int
client_close_proxy(struct archive_read_filter *self)
{
	int r = ARCHIVE_OK, r2;
	unsigned int i;

	if (self->archive->client.closer == NULL)
		return (r);
	for (i = 0; i < self->archive->client.nodes; i++)
	{
		r2 = (self->archive->client.closer)
			((struct archive *)self->archive,
				self->archive->client.dataset[i].data);
		if (r > r2)
			r = r2;
	}
	return (r);
}